

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt.cpp
# Opt level: O2

ostream * docopt::operator<<(ostream *os,value *val)

{
  pointer pbVar1;
  bool bVar2;
  string *psVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar4;
  ostream *poVar5;
  char *pcVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *el;
  pointer pbVar7;
  
  switch(val->kind_) {
  case Bool:
    bVar2 = value::asBool(val);
    pcVar6 = "false";
    if (bVar2) {
      pcVar6 = "true";
    }
    break;
  case Long:
    value::asLong(val);
    std::ostream::_M_insert<long>((long)os);
    return os;
  case String:
    psVar3 = value::asString_abi_cxx11_(val);
    poVar5 = std::operator<<(os,'\"');
    poVar5 = std::operator<<(poVar5,(string *)psVar3);
    std::operator<<(poVar5,'\"');
    return os;
  case StringList:
    pvVar4 = value::asStringList_abi_cxx11_(val);
    std::operator<<(os,"[");
    pbVar1 = (pvVar4->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    bVar2 = true;
    for (pbVar7 = (pvVar4->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; pbVar7 != pbVar1; pbVar7 = pbVar7 + 1)
    {
      if (!bVar2) {
        std::operator<<(os,", ");
      }
      poVar5 = std::operator<<(os,'\"');
      poVar5 = std::operator<<(poVar5,(string *)pbVar7);
      std::operator<<(poVar5,'\"');
      bVar2 = false;
    }
    pcVar6 = "]";
    break;
  default:
    pcVar6 = "null";
  }
  std::operator<<(os,pcVar6);
  return os;
}

Assistant:

DOCOPT_INLINE
std::ostream& docopt::operator<<(std::ostream& os, value const& val)
{
	if (val.isBool()) {
		bool b = val.asBool();
		os << (b ? "true" : "false");
	} else if (val.isLong()) {
		long v = val.asLong();
		os << v;
	} else if (val.isString()) {
		std::string const& str = val.asString();
		os << '"' << str << '"';
	} else if (val.isStringList()) {
		auto const& list = val.asStringList();
		os << "[";
		bool first = true;
		for(auto const& el : list) {
			if (first) {
				first = false;
			} else {
				os << ", ";
			}
			os << '"' << el << '"';
		}
		os << "]";
	} else {
		os << "null";
	}
	return os;
}